

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  undefined8 *puVar1;
  TransformPromiseNodeBase *pTVar2;
  Disposer *in_RCX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *pAVar3;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX;
  _func_int **pp_Var4;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_00;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_01;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_02;
  Disposer *pDVar5;
  Disposer *pDVar6;
  PromiseNode *pPVar7;
  PromiseNode *pPVar8;
  PromiseNode *pPVar9;
  undefined1 *puVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar15;
  Own<kj::_::ChainPromiseNode> OVar16;
  Promise<unsigned_long> PVar17;
  Fault f_1;
  Fault f;
  Own<kj::_::PromiseNode> local_e8;
  Own<kj::_::PromiseNode> local_d8;
  Fault local_c8;
  undefined8 uStack_c0;
  BlockedWrite *local_b0;
  Promise<unsigned_long> local_a8;
  Promise<unsigned_long> local_98;
  Promise<unsigned_long> local_88;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Disposer *local_68;
  AsyncOutputStream *local_60;
  _func_int **local_58;
  PromiseNode *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_b0 = this;
  if (output[8]._vptr_AsyncOutputStream != (_func_int **)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x180,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_c8);
  }
  pDVar5 = (Disposer *)output[5]._vptr_AsyncOutputStream;
  if (in_RCX < pDVar5) {
    (*(code *)**(undefined8 **)amount)(&local_e8,amount,output[4]._vptr_AsyncOutputStream);
    pTVar2 = (TransformPromiseNodeBase *)operator_new(0x38);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar2,&local_e8,
               kj::_::
               TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:389:19),_kj::_::PropagateException>
               ::anon_class_16_2_34952053_for_func::operator());
    (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062aa30;
    pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    pTVar2[1].dependency.disposer = in_RCX;
    local_88.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_88.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
    OVar15 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                       ((kj *)&local_c8,(Canceler *)(output + 8),&local_88);
    pPVar7 = local_88.super_PromiseBase.node.ptr;
    pAVar3 = OVar15.ptr;
    *(undefined4 *)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_c8.exception._0_4_;
    *(undefined4 *)
     ((long)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_c8.exception._4_4_;
    *(undefined4 *)&(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream
         = (undefined4)uStack_c0;
    *(undefined4 *)
     ((long)&(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uStack_c0._4_4_;
    if ((TransformPromiseNodeBase *)local_88.super_PromiseBase.node.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_88.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_88.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_88.super_PromiseBase.node.disposer,
                 ((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode);
      pAVar3 = extraout_RDX;
    }
    pTVar2 = (TransformPromiseNodeBase *)local_e8.ptr;
    if ((TransformPromiseNodeBase *)local_e8.ptr == (TransformPromiseNodeBase *)0x0)
    goto LAB_0045bd15;
    local_e8.ptr = (PromiseNode *)0x0;
    pDVar5 = local_e8.disposer;
  }
  else {
    pPVar7 = (PromiseNode *)output[7]._vptr_AsyncOutputStream;
    if (pPVar7 == (PromiseNode *)0x0) {
      pPVar9 = (PromiseNode *)0x0;
    }
    else {
      pp_Var4 = output[6]._vptr_AsyncOutputStream + 1;
      pPVar8 = (PromiseNode *)0x0;
      do {
        pDVar6 = (Disposer *)(*pp_Var4 + (long)pDVar5);
        pPVar9 = pPVar8;
        if (in_RCX < pDVar6) break;
        pPVar8 = (PromiseNode *)((long)&pPVar8->_vptr_PromiseNode + 1);
        pp_Var4 = pp_Var4 + 2;
        pDVar5 = pDVar6;
        pPVar9 = pPVar7;
      } while (pPVar7 != pPVar8);
    }
    local_60 = output + 8;
    (*(code *)**(undefined8 **)amount)(&local_d8,amount,output[4]._vptr_AsyncOutputStream);
    if (pPVar9 != (PromiseNode *)0x0) {
      local_78 = (Exception *)output[6]._vptr_AsyncOutputStream;
      pTVar2 = (TransformPromiseNodeBase *)operator_new(0x40);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar2,&local_d8,
                 kj::_::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:410:32),_kj::_::PropagateException>
                 ::anon_class_24_2_d8a1eacd_for_func::operator());
      (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062aab8;
      pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
      pTVar2[1].dependency.disposer = (Disposer *)local_78;
      pTVar2[1].dependency.ptr = pPVar9;
      local_e8.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
            ::instance;
      local_e8.ptr = (PromiseNode *)pTVar2;
      OVar16 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_c8,&local_e8);
      pPVar7 = local_e8.ptr;
      uVar11 = local_c8.exception._0_4_;
      uVar12 = local_c8.exception._4_4_;
      uVar13 = (undefined4)uStack_c0;
      uVar14 = uStack_c0._4_4_;
      if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
        local_e8.ptr = (PromiseNode *)0x0;
        local_78 = local_c8.exception;
        uStack_70 = (undefined4)uStack_c0;
        uStack_6c = uStack_c0._4_4_;
        (**(local_e8.disposer)->_vptr_Disposer)
                  (local_e8.disposer,
                   ((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode,OVar16.ptr)
        ;
        uVar11 = (undefined4)local_78;
        uVar12 = local_78._4_4_;
        uVar13 = uStack_70;
        uVar14 = uStack_6c;
      }
      pPVar7 = local_d8.ptr;
      puVar1 = (undefined8 *)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_);
      local_d8.ptr = (PromiseNode *)CONCAT44(uVar14,uVar13);
      local_d8.disposer._0_4_ = uVar11;
      local_d8.disposer._4_4_ = uVar12;
      if ((TransformPromiseNodeBase *)pPVar7 != (TransformPromiseNodeBase *)0x0) {
        (**(code **)*puVar1)
                  (puVar1,((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                          (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode);
      }
    }
    local_78 = (Exception *)output[7]._vptr_AsyncOutputStream;
    if ((Exception *)pPVar9 == local_78) {
      pTVar2 = (TransformPromiseNodeBase *)operator_new(0x48);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar2,&local_d8,
                 kj::_::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:415:43),_kj::_::PropagateException>
                 ::anon_class_32_4_246a692a_for_func::operator());
      (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062ab40;
      pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar2[1].dependency.disposer = (Disposer *)amount;
      pTVar2[1].dependency.ptr = (PromiseNode *)in_RCX;
      pTVar2[1].continuationTracePtr = pDVar5;
      local_e8.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
            ::instance;
      local_e8.ptr = (PromiseNode *)pTVar2;
      OVar16 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_c8,&local_e8);
      pPVar7 = local_e8.ptr;
      local_a8.super_PromiseBase.node.disposer._0_4_ = local_c8.exception._0_4_;
      local_a8.super_PromiseBase.node.disposer._4_4_ = local_c8.exception._4_4_;
      local_a8.super_PromiseBase.node.ptr = uStack_c0;
      if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
        local_e8.ptr = (PromiseNode *)0x0;
        (**(local_e8.disposer)->_vptr_Disposer)
                  (local_e8.disposer,
                   ((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode,OVar16.ptr)
        ;
      }
      OVar15 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                         ((kj *)&local_c8,(Canceler *)local_60,&local_a8);
      pPVar7 = local_a8.super_PromiseBase.node.ptr;
      pAVar3 = OVar15.ptr;
      *(undefined4 *)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
           = local_c8.exception._0_4_;
      *(undefined4 *)
       ((long)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
           local_c8.exception._4_4_;
      *(undefined4 *)
       &(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
           (undefined4)uStack_c0;
      *(undefined4 *)
       ((long)&(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4)
           = uStack_c0._4_4_;
      if (local_a8.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
        local_a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                             local_a8.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                            local_a8.super_PromiseBase.node.disposer._0_4_),
                   pPVar7->_vptr_PromiseNode[-2] + (long)&pPVar7->_vptr_PromiseNode);
        pAVar3 = extraout_RDX_00;
      }
    }
    else {
      pPVar7 = (PromiseNode *)((long)in_RCX - (long)pDVar5);
      local_58 = output[6]._vptr_AsyncOutputStream;
      local_50 = (PromiseNode *)((long)local_58[(long)pPVar9 * 2 + 1] - (long)pPVar7);
      if ((PromiseNode *)local_58[(long)pPVar9 * 2 + 1] < pPVar7) {
        local_e8.disposer = (Disposer *)0x0;
        local_c8.exception = (Exception *)0x0;
        uStack_c0 = (PromiseNode *)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_e8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_e8);
      }
      local_68 = (Disposer *)local_58[(long)pPVar9 * 2];
      if (in_RCX != pDVar5) {
        pTVar2 = (TransformPromiseNodeBase *)operator_new(0x40);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar2,&local_d8,
                   kj::_::
                   TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:437:34),_kj::_::PropagateException>
                   ::anon_class_24_2_e72e484a_for_func::operator());
        (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062ac50;
        pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
        pTVar2[1].dependency.disposer = local_68;
        pTVar2[1].dependency.ptr = pPVar7;
        local_e8.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#4},kj::_::PropagateException>>
              ::instance;
        local_e8.ptr = (PromiseNode *)pTVar2;
        OVar16 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                           ((kj *)&local_c8,&local_e8);
        pPVar8 = local_e8.ptr;
        uVar11 = local_c8.exception._0_4_;
        uVar12 = local_c8.exception._4_4_;
        uVar13 = (undefined4)uStack_c0;
        uVar14 = uStack_c0._4_4_;
        if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
          local_e8.ptr = (PromiseNode *)0x0;
          local_48 = local_c8.exception._0_4_;
          uStack_44 = local_c8.exception._4_4_;
          uStack_40 = (undefined4)uStack_c0;
          uStack_3c = uStack_c0._4_4_;
          (**(local_e8.disposer)->_vptr_Disposer)
                    (local_e8.disposer,
                     ((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode,
                     OVar16.ptr);
          uVar11 = local_48;
          uVar12 = uStack_44;
          uVar13 = uStack_40;
          uVar14 = uStack_3c;
        }
        pPVar8 = local_d8.ptr;
        puVar1 = (undefined8 *)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_);
        local_d8.ptr = (PromiseNode *)CONCAT44(uVar14,uVar13);
        local_d8.disposer._0_4_ = uVar11;
        local_d8.disposer._4_4_ = uVar12;
        if ((TransformPromiseNodeBase *)pPVar8 != (TransformPromiseNodeBase *)0x0) {
          (**(code **)*puVar1)
                    (puVar1,((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                            (long)&((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode);
        }
      }
      pTVar2 = (TransformPromiseNodeBase *)operator_new(0x58);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar2,&local_d8,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:442:43),_kj::_::PropagateException>
                 ::anon_class_48_4_354179c9_for_func::operator());
      puVar10 = (undefined1 *)((long)&pPVar9->_vptr_PromiseNode + 1);
      (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062acd8;
      pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar2[1].dependency.disposer = (Disposer *)((long)local_68 + (long)pPVar7);
      pTVar2[1].dependency.ptr = local_50;
      pTVar2[1].continuationTracePtr = local_58 + (long)puVar10 * 2;
      pTVar2[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)((long)local_78 - (long)puVar10)
      ;
      pTVar2[2].dependency.disposer = in_RCX;
      local_98.super_PromiseBase.node.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#5},kj::_::PropagateException>>
            ::instance;
      local_98.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
      OVar15 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                         ((kj *)&local_c8,(Canceler *)local_60,&local_98);
      pPVar7 = local_98.super_PromiseBase.node.ptr;
      pAVar3 = OVar15.ptr;
      *(undefined4 *)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
           = local_c8.exception._0_4_;
      *(undefined4 *)
       ((long)&(local_b0->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
           local_c8.exception._4_4_;
      *(undefined4 *)
       &(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
           (undefined4)uStack_c0;
      *(undefined4 *)
       ((long)&(local_b0->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4)
           = uStack_c0._4_4_;
      if ((TransformPromiseNodeBase *)local_98.super_PromiseBase.node.ptr !=
          (TransformPromiseNodeBase *)0x0) {
        local_98.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (**(local_98.super_PromiseBase.node.disposer)->_vptr_Disposer)
                  (local_98.super_PromiseBase.node.disposer,
                   ((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode);
        pAVar3 = extraout_RDX_01;
      }
    }
    pTVar2 = (TransformPromiseNodeBase *)local_d8.ptr;
    if ((TransformPromiseNodeBase *)local_d8.ptr == (TransformPromiseNodeBase *)0x0)
    goto LAB_0045bd15;
    local_d8.ptr = (PromiseNode *)0x0;
    pDVar5 = (Disposer *)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_);
  }
  (**pDVar5->_vptr_Disposer)
            (pDVar5,(pTVar2->super_PromiseNode)._vptr_PromiseNode[-2] +
                    (long)&(pTVar2->super_PromiseNode)._vptr_PromiseNode);
  pAVar3 = extraout_RDX_02;
LAB_0045bd15:
  PVar17.super_PromiseBase.node.ptr = (PromiseNode *)pAVar3;
  PVar17.super_PromiseBase.node.disposer = (Disposer *)local_b0;
  return (Promise<unsigned_long>)PVar17.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      if (amount < writeBuffer.size()) {
        // Consume a portion of the write buffer.
        return canceler.wrap(output.write(writeBuffer.begin(), amount)
            .then([this,amount]() {
          writeBuffer = writeBuffer.slice(amount, writeBuffer.size());
          // We pumped the full amount, so we're done pumping.
          return amount;
        }));
      }

      // First piece doesn't cover the whole pump. Figure out how many more pieces to add.
      uint64_t actual = writeBuffer.size();
      size_t i = 0;
      while (i < morePieces.size() &&
             amount >= actual + morePieces[i].size()) {
        actual += morePieces[i++].size();
      }

      // Write the first piece.
      auto promise = output.write(writeBuffer.begin(), writeBuffer.size());

      // Write full pieces as a single gather-write.
      if (i > 0) {
        auto more = morePieces.slice(0, i);
        promise = promise.then([&output,more]() { return output.write(more); });
      }

      if (i == morePieces.size()) {
        // This will complete the write.
        return canceler.wrap(promise.then([this,&output,amount,actual]() -> Promise<uint64_t> {
          canceler.release();
          fulfiller.fulfill();
          pipe.endState(*this);

          if (actual == amount) {
            // Oh, we had exactly enough.
            return actual;
          } else {
            return pipe.pumpTo(output, amount - actual)
                .then([actual](uint64_t actual2) { return actual + actual2; });
          }
        }));
      } else {
        // Pump ends mid-piece. Write the last, partial piece.
        auto n = amount - actual;
        auto splitPiece = morePieces[i];
        KJ_ASSERT(n <= splitPiece.size());
        auto newWriteBuffer = splitPiece.slice(n, splitPiece.size());
        auto newMorePieces = morePieces.slice(i + 1, morePieces.size());
        auto prefix = splitPiece.slice(0, n);
        if (prefix.size() > 0) {
          promise = promise.then([&output,prefix]() {
            return output.write(prefix.begin(), prefix.size());
          });
        }

        return canceler.wrap(promise.then([this,newWriteBuffer,newMorePieces,amount]() {
          writeBuffer = newWriteBuffer;
          morePieces = newMorePieces;
          canceler.release();
          return amount;
        }));
      }
    }